

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_string
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  ushort uVar1;
  element_type *peVar2;
  ulong uVar3;
  char *pcVar4;
  ImageObject *pIVar5;
  bool bVar6;
  bool bVar7;
  Atom *pAVar8;
  byte bVar9;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  int iVar10;
  uint uVar11;
  string *psVar12;
  long lVar13;
  Atom local_11c [4];
  uint16_t *local_118;
  uint local_110;
  undefined4 local_10c;
  string str;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_88;
  Class local_78;
  
  local_10c = (undefined4)CONCAT71(in_register_00000011,enforce);
  local_118 = extent_index;
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar6 = read_nil_st(this,(Ptr *)&local_88,write_index,(uint16_t *)p,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  if (bVar6) {
    return true;
  }
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  Class::Class(&local_78,STRING);
  bVar6 = read_variable(this,(Ptr *)&local_e8,write_index,(uint16_t *)p,write,&local_78);
  Class::~Class(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  if (!bVar6) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    extent_index_00 = local_118;
    bVar6 = read_reference(this,(Ptr *)&local_98,write_index,local_118,write,STRING);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    if (!bVar6) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar6 = read_wildcard(this,(Ptr *)&local_a8,write_index,extent_index_00,write);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      if (!bVar6) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar6 = read_tail_wildcard(this,(Ptr *)&local_b8,write_index,extent_index_00,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        if (!bVar6) {
          peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          uVar3 = (peVar2->cmd)._M_string_length;
          if (2 < uVar3) {
            psVar12 = &peVar2->cmd;
            pcVar4 = (psVar12->_M_dataplus)._M_p;
            if ((*pcVar4 == '\"') && (pcVar4[uVar3 - 1] == '\"')) {
              if (!write) {
                return true;
              }
              std::__cxx11::string::substr((ulong)&str,(ulong)psVar12);
              r_code::Atom::IPointer((ushort)local_11c);
              pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(this->current_object + 8),
                                  (ulong)write_index);
              r_code::Atom::operator=(pAVar8,local_11c);
              r_code::Atom::~Atom(local_11c);
              r_code::Atom::String((uchar)local_11c);
              pIVar5 = this->current_object;
              uVar1 = *local_118;
              *local_118 = uVar1 + 1;
              pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(pIVar5 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar8,local_11c);
              r_code::Atom::~Atom(local_11c);
              uVar11 = 0;
              bVar9 = 0;
              for (lVar13 = 0; (ushort)lVar13 < (ushort)str._M_string_length; lVar13 = lVar13 + 1) {
                uVar11 = uVar11 | (int)str._M_dataplus._M_p[lVar13] << (bVar9 & 0x1f);
                bVar9 = bVar9 + 8;
                if (bVar9 == 0x20) {
                  r_code::Atom::Atom(local_11c,uVar11);
                  pIVar5 = this->current_object;
                  uVar1 = *local_118;
                  *local_118 = uVar1 + 1;
                  pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar5 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar8,local_11c);
                  r_code::Atom::~Atom(local_11c);
                  uVar11 = 0;
                  bVar9 = 0;
                }
              }
              if ((str._M_string_length & 3) != 0) {
                r_code::Atom::Atom(local_11c,uVar11);
                pIVar5 = this->current_object;
                uVar1 = *local_118;
                *local_118 = uVar1 + 1;
                pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar5 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar8,local_11c);
                r_code::Atom::~Atom(local_11c);
              }
              std::__cxx11::string::~string((string *)&str);
              return true;
            }
          }
          local_110 = (uint)(this->state).pattern_lvl;
          bVar6 = (this->state).no_arity_check;
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c8,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar7 = expression(this,(Ptr *)&local_c8,STRING,write_index,local_118,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
          if (!bVar7) {
            iVar10 = (uint)bVar6 * 0x10000 + local_110;
            (this->state).pattern_lvl = (uint16_t)iVar10;
            (this->state).no_arity_check = SUB41((uint)iVar10 >> 0x10,0);
            if ((char)local_10c != '\0') {
              std::__cxx11::string::string
                        ((string *)&str," error: expected a string",(allocator *)local_11c);
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_d8,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              set_error(this,&str,(Ptr *)&local_d8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_d8._M_refcount);
              std::__cxx11::string::~string((string *)&str);
            }
            return false;
          }
          return true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Compiler::read_string(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL
{
    if (read_nil_st(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, STRING)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, STRING)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd.size() > 2 && node->cmd[0] == '"' && node->cmd[node->cmd.length() - 1] == '"') {
        if (write) {
            std::string str = node->cmd.substr(1, node->cmd.size() - 2);
            uint16_t l = (uint16_t)str.length(); // TODO: check string length
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::String(l);
            uint64_t _st = 0;
            int8_t shift = 0;

            for (uint16_t i = 0; i < l; ++i) {
                _st |= str[i] << shift;
                shift += 8;

                if (shift == 32) {
                    current_object->code[extent_index++] = _st;
                    _st = 0;
                    shift = 0;
                }
            }

            if (l % 4) {
                current_object->code[extent_index++] = _st;
            }
        }

        return true;
    }

    State s = save_state();

    if (expression(node, STRING, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a string", node);
        return false;
    }

    return false;
}